

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::RegisterTests
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest> *this)

{
  bool bVar1;
  undefined1 condition;
  undefined1 uVar2;
  int iVar3;
  pointer pIVar4;
  ulong uVar5;
  element_type *peVar6;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
  *factory;
  ostream *poVar7;
  size_type sVar8;
  void *this_00;
  char *filename;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
  *ptVar9;
  undefined4 extraout_var;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  bool in_stack_000000c7;
  CodeLocation *in_stack_000000c8;
  string *in_stack_000000d0;
  string param_name;
  Message test_name_stream;
  iterator param_it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  string test_suite_name;
  int line;
  char *file;
  undefined1 *name_func;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  generator;
  string *instantiation_name;
  iterator gen_it;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>
  test_info;
  iterator test_it;
  bool generated_instantiations;
  CodeLocation *in_stack_fffffffffffffc58;
  CodeLocation *in_stack_fffffffffffffc60;
  string *in_stack_fffffffffffffc68;
  TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  *in_stack_fffffffffffffc70;
  value_type *in_stack_fffffffffffffc78;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc88;
  pointer in_stack_fffffffffffffc90;
  CodeLocation *in_stack_fffffffffffffca8;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
  *in_stack_fffffffffffffcc8;
  int line_00;
  char *in_stack_fffffffffffffcd0;
  Message *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  void *in_stack_fffffffffffffd38;
  CodeLocation *in_stack_fffffffffffffd40;
  ostream *in_stack_fffffffffffffd48;
  ostream *in_stack_fffffffffffffd50;
  ostream *in_stack_fffffffffffffd58;
  ostream *in_stack_fffffffffffffd60;
  undefined6 in_stack_fffffffffffffd70;
  TearDownTestSuiteFunc tear_down_tc;
  undefined4 local_238;
  int iStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  aom_img_fmt local_228;
  aom_bit_depth_t aStack_224;
  uint uStack_220;
  uint uStack_21c;
  uint local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
  *in_stack_fffffffffffffe08;
  string local_1d0 [32];
  string local_1b0 [32];
  _Base_ptr local_190;
  undefined1 local_188;
  GTestLog local_180;
  GTestLog local_17c;
  undefined1 local_178 [72];
  string local_130 [104];
  long local_c8;
  string local_c0 [32];
  string local_a0 [36];
  int local_7c;
  char *local_78;
  TearDownTestSuiteFunc local_70;
  undefined1 local_58 [16];
  pointer local_48;
  InstantiationInfo *local_40;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>_>
  local_38 [3];
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>
  *local_20;
  __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>_>
  local_18;
  byte local_9;
  
  local_9 = 0;
  local_18._M_current =
       (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>
        *)std::
          vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>
          ::begin((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>
                   *)in_stack_fffffffffffffc58);
  while( true ) {
    local_20 = (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>
                *)std::
                  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>
                  ::end((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>
                         *)in_stack_fffffffffffffc58);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffc60,
                       (__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffc58);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>_>
    ::operator*(&local_18);
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>
    ::shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>
                  *)in_stack_fffffffffffffc60,
                 (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>
                  *)in_stack_fffffffffffffc58);
    local_38[0]._M_current =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>
         ::begin((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>
                  *)in_stack_fffffffffffffc58);
    while( true ) {
      local_40 = (InstantiationInfo *)
                 std::
                 vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>
                 ::end((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>
                        *)in_stack_fffffffffffffc58);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffc60,
                         (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffc58);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>_>
                 ::operator->(local_38);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      (*(code *)pIVar4->generator)(local_58);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_70 = (TearDownTestSuiteFunc)pIVar4->name_func;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_78 = pIVar4->file;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_7c = pIVar4->line;
      std::__cxx11::string::string(local_a0);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
        std::__cxx11::string::operator=(local_a0,local_c0);
        std::__cxx11::string::~string(local_c0);
      }
      peVar6 = std::
               __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x8a5e1e);
      std::__cxx11::string::operator+=(local_a0,(string *)peVar6);
      local_c8 = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x8a5e49);
      ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
      ::begin((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
               *)in_stack_fffffffffffffc68);
      while( true ) {
        ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
        ::end((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
               *)in_stack_fffffffffffffc68);
        bVar1 = ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
                ::operator!=((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
                              *)in_stack_fffffffffffffc60,
                             (ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
                              *)in_stack_fffffffffffffc58);
        ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
        ::~ParamIterator((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
                          *)0x8a5ea4);
        iVar3 = (int)((ulong)in_stack_fffffffffffffca8 >> 0x20);
        line_00 = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
        if (!bVar1) break;
        local_9 = 1;
        Message::Message((Message *)in_stack_fffffffffffffc90);
        tear_down_tc = local_70;
        factory = ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
                  ::operator*((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
                               *)0x8a5f4d);
        TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
        ::TestParamInfo(in_stack_fffffffffffffc70,
                        (tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                         *)in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
        (*tear_down_tc)(local_130,local_178);
        condition = IsValidParamName(in_stack_fffffffffffffc68);
        uVar2 = IsTrue((bool)condition);
        if (!(bool)uVar2) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                             in_stack_fffffffffffffcd0,line_00);
          poVar7 = GTestLog::GetStream(&local_17c);
          poVar7 = std::operator<<(poVar7,"Condition IsValidParamName(param_name) failed. ");
          in_stack_fffffffffffffd60 = std::operator<<(poVar7,"Parameterized test name \'");
          in_stack_fffffffffffffd58 = std::operator<<(in_stack_fffffffffffffd60,local_130);
          in_stack_fffffffffffffd50 =
               std::operator<<(in_stack_fffffffffffffd58,"\' is invalid, in ");
          in_stack_fffffffffffffd48 = std::operator<<(in_stack_fffffffffffffd50,local_78);
          in_stack_fffffffffffffd40 =
               (CodeLocation *)std::operator<<(in_stack_fffffffffffffd48," line ");
          in_stack_fffffffffffffd38 =
               (void *)std::ostream::operator<<(in_stack_fffffffffffffd40,local_7c);
          std::ostream::operator<<(in_stack_fffffffffffffd38,std::endl<char,std::char_traits<char>>)
          ;
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffc60);
        }
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        bVar1 = IsTrue(sVar8 == 0);
        if (!bVar1) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                             in_stack_fffffffffffffcd0,line_00);
          poVar7 = GTestLog::GetStream(&local_180);
          poVar7 = std::operator<<(poVar7,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar7 = std::operator<<(poVar7,"Duplicate parameterized test name \'");
          poVar7 = std::operator<<(poVar7,local_130);
          poVar7 = std::operator<<(poVar7,"\', in ");
          poVar7 = std::operator<<(poVar7,local_78);
          poVar7 = std::operator<<(poVar7," line ");
          this_00 = (void *)std::ostream::operator<<(poVar7,local_7c);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffc60);
        }
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        local_190 = (_Base_ptr)pVar10.first._M_node;
        in_stack_fffffffffffffce7 = pVar10.second;
        local_188 = in_stack_fffffffffffffce7;
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x8a6336);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::
          __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x8a6353);
          in_stack_fffffffffffffcd8 =
               Message::operator<<((Message *)in_stack_fffffffffffffc60,
                                   &in_stack_fffffffffffffc58->file);
          Message::operator<<((Message *)in_stack_fffffffffffffc60,
                              (char (*) [2])in_stack_fffffffffffffc58);
        }
        Message::operator<<((Message *)in_stack_fffffffffffffc60,&in_stack_fffffffffffffc58->file);
        in_stack_fffffffffffffcd0 = (char *)std::__cxx11::string::c_str();
        Message::GetString_abi_cxx11_((Message *)in_stack_fffffffffffffc68);
        std::__cxx11::string::c_str();
        in_stack_fffffffffffffcc8 =
             ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
             ::operator*((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
                          *)0x8a63e8);
        PrintToString<std::tuple<libaom_test::CodecFactory_const*,(anonymous_namespace)::TestVideoParam,std::tuple<int,int>>>
                  (in_stack_fffffffffffffe08);
        std::__cxx11::string::c_str();
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x8a6422);
        CodeLocation::CodeLocation(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
        filename = (char *)(**(code **)(*in_RDI + 0x18))();
        in_stack_fffffffffffffc58 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::
             GetSetUpCaseOrSuite(filename,iVar3);
        in_stack_fffffffffffffc60 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::
             GetTearDownCaseOrSuite(filename,(int)((ulong)in_stack_fffffffffffffc58 >> 0x20));
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x8a6493);
        in_stack_fffffffffffffc90 =
             std::
             unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>_>_>
             ::operator->((unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>_>_>
                           *)0x8a649f);
        ptVar9 = ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
                 ::operator*((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
                              *)0x8a64b1);
        local_238 = (ptVar9->
                    super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                    ).
                    super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                    .super__Tuple_impl<2UL,_std::tuple<int,_int>_>.
                    super__Head_base<2UL,_std::tuple<int,_int>,_false>._M_head_impl.
                    super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>;
        iStack_234 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                     ).
                     super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                     .super__Tuple_impl<2UL,_std::tuple<int,_int>_>.
                     super__Head_base<2UL,_std::tuple<int,_int>,_false>._M_head_impl.
                     super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
        ;
        uStack_230 = *(undefined4 *)
                      &(ptVar9->
                       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                       ).
                       super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                       .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict
                       ._M_head_impl.filename;
        uStack_22c = *(undefined4 *)
                      ((long)&(ptVar9->
                              super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                              ).
                              super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                              .
                              super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict
                              ._M_head_impl.filename + 4);
        local_228 = (ptVar9->
                    super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                    ).
                    super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                    .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
                    _M_head_impl.fmt;
        aStack_224 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                     ).
                     super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                     .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
                     _M_head_impl.bit_depth;
        uStack_220 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                     ).
                     super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                     .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
                     _M_head_impl.profile;
        uStack_21c = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                     ).
                     super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                     .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
                     _M_head_impl.limit;
        local_218 = (ptVar9->
                    super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                    ).
                    super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                    .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
                    _M_head_impl.screen_content;
        uStack_214 = *(undefined4 *)
                      &(ptVar9->
                       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                       ).
                       super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                       .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict
                       ._M_head_impl.field_0x1c;
        uStack_210 = *(undefined4 *)
                      &(ptVar9->
                       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                       ).
                       super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                       .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict
                       ._M_head_impl.psnr_threshold;
        uStack_20c = *(undefined4 *)
                      ((long)&(ptVar9->
                              super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                              ).
                              super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                              .
                              super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict
                              ._M_head_impl.psnr_threshold + 4);
        local_208 = *(undefined4 *)
                     &(ptVar9->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                      ).
                      super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                      .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
                      _M_head_impl.psnr_threshold2;
        uStack_204 = *(undefined4 *)
                      ((long)&(ptVar9->
                              super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                              ).
                              super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                              .
                              super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict
                              ._M_head_impl.psnr_threshold2 + 4);
        uStack_200 = *(undefined4 *)
                      &(ptVar9->
                       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                       ).super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>.
                       _M_head_impl;
        uStack_1fc = *(undefined4 *)
                      ((long)&(ptVar9->
                              super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
                              ).super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>.
                              _M_head_impl + 4);
        iVar3 = (*in_stack_fffffffffffffc90->_vptr_TestMetaFactoryBase[2])
                          (in_stack_fffffffffffffc90,&local_238);
        in_stack_fffffffffffffc68 = (string *)CONCAT44(extraout_var,iVar3);
        in_stack_fffffffffffffc88 = in_stack_fffffffffffffc68;
        in_stack_fffffffffffffca8 = in_stack_fffffffffffffc58;
        MakeAndRegisterTestInfo
                  ((char *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,
                   (char *)in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                   in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                   (SetUpTestSuiteFunc)CONCAT17(condition,CONCAT16(uVar2,in_stack_fffffffffffffd70))
                   ,tear_down_tc,(TestFactoryBase *)factory);
        CodeLocation::~CodeLocation((CodeLocation *)0x8a655a);
        std::__cxx11::string::~string(local_1d0);
        std::__cxx11::string::~string(local_1b0);
        std::__cxx11::string::~string(local_130);
        Message::~Message((Message *)0x8a658e);
        ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
        ::operator++((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
                      *)in_stack_fffffffffffffc60);
        local_c8 = local_c8 + 1;
      }
      ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
      ::~ParamIterator((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
                        *)0x8a5ebc);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x8a6653);
      std::__cxx11::string::~string(local_a0);
      ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
      ::~ParamGenerator((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
                         *)0x8a666d);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>_>
      ::operator++(local_38);
    }
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>
    ::~shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>
                   *)0x8a66b5);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>_>
    ::operator++(&local_18);
  }
  if ((local_9 & 1) == 0) {
    (**(code **)(*in_RDI + 0x10))();
    CodeLocation::CodeLocation(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    std::
    vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>
    ::empty((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>
             *)in_stack_fffffffffffffc70);
    InsertSyntheticTestCase(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7);
    CodeLocation::~CodeLocation((CodeLocation *)0x8a674f);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }